

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

Instr * __thiscall FlowGraph::PeepTypedCm(FlowGraph *this,Instr *instr)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  OpCode OVar4;
  Instr *pIVar5;
  Instr *pIVar6;
  Instr *this_00;
  RegOpnd *pRVar7;
  RegOpnd *opnd;
  undefined4 *puVar8;
  RegOpnd *dstOpnd;
  IntConstOpnd *pIVar9;
  BranchInstr *this_01;
  Func *func;
  Opnd *pOVar10;
  Instr *this_02;
  IntConstType value;
  Func **ppFVar11;
  IntConstType local_40;
  
  pIVar5 = IR::Instr::GetNextRealInstrOrLabel(instr);
  OVar1 = pIVar5->m_opcode;
  if (OVar1 == Ld_I4) {
    pIVar6 = IR::Instr::GetNextRealInstrOrLabel(pIVar5);
    OVar1 = pIVar6->m_opcode;
    if (OVar1 != Ld_I4) goto LAB_003f8f7b;
    this_00 = IR::Instr::GetNextRealInstrOrLabel(pIVar6);
    OVar1 = this_00->m_opcode;
    this_02 = pIVar6;
  }
  else {
    pIVar6 = pIVar5;
    pIVar5 = (Instr *)0x0;
LAB_003f8f7b:
    this_02 = (Instr *)0x0;
    this_00 = pIVar6;
  }
  if ((OVar1 & ~ExtendedOpcodePrefix) != BrTrue_I4) {
    return (Instr *)0x0;
  }
  if (this_02 == (Instr *)0x0 || pIVar5 != (Instr *)0x0) {
    if ((pIVar5 != (Instr *)0x0) && (bVar3 = IR::Opnd::IsEqual(pIVar5->m_src1,instr->m_dst), !bVar3)
       ) {
      return (Instr *)0x0;
    }
    if (this_02 != (Instr *)0x0) goto LAB_003f9023;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x9cb,"(instrLd || (!instrLd && !instrLd2))",
                       "Either instrLd is non-null or both null");
    if (!bVar3) goto LAB_003f9614;
    *puVar8 = 0;
LAB_003f9023:
    bVar3 = IR::Opnd::IsEqual(this_02->m_src1,pIVar5->m_dst);
    if (!bVar3) {
      return (Instr *)0x0;
    }
  }
  bVar3 = IR::Opnd::IsEqual(instr->m_dst,this_00->m_src1);
  if (((!bVar3) &&
      ((pIVar5 == (Instr *)0x0 || (bVar3 = IR::Opnd::IsEqual(pIVar5->m_dst,this_00->m_src1), !bVar3)
       ))) && ((this_02 == (Instr *)0x0 ||
               (bVar3 = IR::Opnd::IsEqual(this_02->m_dst,this_00->m_src1), !bVar3)))) {
    return (Instr *)0x0;
  }
  pRVar7 = (RegOpnd *)IR::Instr::UnlinkSrc1(instr);
  opnd = (RegOpnd *)IR::Instr::UnlinkSrc2(instr);
  bVar3 = IR::Opnd::IsEqual(instr->m_dst,(Opnd *)pRVar7);
  if (((bVar3) ||
      ((pIVar5 != (Instr *)0x0 && (bVar3 = IR::Opnd::IsEqual(pIVar5->m_dst,(Opnd *)pRVar7), bVar3)))
      ) || ((dstOpnd = pRVar7, this_02 != (Instr *)0x0 &&
            (bVar3 = IR::Opnd::IsEqual(this_02->m_dst,(Opnd *)pRVar7), bVar3)))) {
    if ((pRVar7->super_Opnd).m_type != TyInt32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x9ea,"(src1->IsInt32())","src1->IsInt32()");
      if (!bVar3) goto LAB_003f9614;
      *puVar8 = 0;
    }
    dstOpnd = IR::RegOpnd::New(TyInt32,instr->m_func);
    pIVar6 = IR::Instr::New(Ld_I4,&dstOpnd->super_Opnd,(Opnd *)pRVar7,instr->m_func);
    IR::Instr::SetByteCodeOffset(pIVar6,instr);
    IR::Instr::InsertBefore(instr,pIVar6);
  }
  bVar3 = IR::Opnd::IsEqual(instr->m_dst,(Opnd *)opnd);
  if (((bVar3) ||
      ((pIVar5 != (Instr *)0x0 && (bVar3 = IR::Opnd::IsEqual(pIVar5->m_dst,(Opnd *)opnd), bVar3))))
     || ((this_02 != (Instr *)0x0 && (bVar3 = IR::Opnd::IsEqual(this_02->m_dst,(Opnd *)opnd), bVar3)
         ))) {
    if ((opnd->super_Opnd).m_type != TyInt32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x9f5,"(src2->IsInt32())","src2->IsInt32()");
      if (!bVar3) goto LAB_003f9614;
      *puVar8 = 0;
    }
    pRVar7 = IR::RegOpnd::New(TyInt32,instr->m_func);
    pIVar6 = IR::Instr::New(Ld_I4,&pRVar7->super_Opnd,(Opnd *)opnd,instr->m_func);
    IR::Instr::SetByteCodeOffset(pIVar6,instr);
    IR::Instr::InsertBefore(instr,pIVar6);
    opnd = pRVar7;
  }
  IR::Instr::ReplaceSrc1(this_00,&dstOpnd->super_Opnd);
  IR::Instr::SetSrc2(this_00,&opnd->super_Opnd);
  switch(instr->m_opcode) {
  case CmUnGe_A:
    OVar4 = BrUnGe_A;
    break;
  case CmUnGt_A:
    OVar4 = BrUnGt_A;
    break;
  case CmUnLt_A:
    OVar4 = BrUnLt_A;
    break;
  case CmUnLe_A:
    OVar4 = BrUnLe_A;
    break;
  case CmEq_I4:
    OVar4 = BrEq_I4;
    break;
  case CmNeq_I4:
    OVar4 = BrNeq_I4;
    break;
  case CmLt_I4:
    OVar4 = BrLt_I4;
    break;
  case CmLe_I4:
    OVar4 = BrLe_I4;
    break;
  case CmGt_I4:
    OVar4 = BrGt_I4;
    break;
  case CmGe_I4:
    OVar4 = BrGe_I4;
    break;
  case CmUnLt_I4:
    OVar4 = BrUnLt_I4;
    break;
  case CmUnLe_I4:
    OVar4 = BrUnLe_I4;
    break;
  case CmUnGt_I4:
    OVar4 = BrUnGt_I4;
    break;
  case CmUnGe_I4:
    OVar4 = BrUnGe_I4;
    break;
  default:
    switch(instr->m_opcode) {
    case CmEq_A:
      OVar4 = BrEq_A;
      break;
    case CmGe_A:
      OVar4 = BrGe_A;
      break;
    case CmGt_A:
      OVar4 = BrGt_A;
      break;
    case CmLt_A:
      OVar4 = BrLt_A;
      break;
    case CmLe_A:
      OVar4 = BrLe_A;
      break;
    case CmNeq_A:
      OVar4 = BrNeq_A;
      break;
    case CmSrEq_A:
      OVar4 = BrSrEq_A;
      break;
    case CmSrNeq_A:
      OVar4 = BrSrNeq_A;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xa48,"((0))","(0)");
      if (!bVar3) {
LAB_003f9614:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
      OVar4 = InvalidOpCode;
    }
  }
  this_00->m_opcode = OVar4;
  if (OVar1 == BrTrue_I4) {
    pIVar9 = IR::IntConstOpnd::New(1,TyInt8,instr->m_func,false);
    IR::Instr::SetSrc1(instr,&pIVar9->super_Opnd);
    instr->m_opcode = Ld_I4;
    pOVar10 = instr->m_dst;
    pIVar9 = IR::IntConstOpnd::New(0,TyInt8,instr->m_func,false);
    pIVar6 = IR::Instr::New(Ld_I4,pOVar10,&pIVar9->super_Opnd,instr->m_func);
    IR::Instr::SetByteCodeOffset(pIVar6,this_00);
    IR::Instr::InsertAfter(this_00,pIVar6);
    if (pIVar5 == (Instr *)0x0) {
      return this_00;
    }
    ppFVar11 = &instr->m_func;
    local_40 = 0;
    value = 1;
    pIVar9 = IR::IntConstOpnd::New(1,TyInt8,*ppFVar11,false);
    IR::Instr::ReplaceSrc1(pIVar5,&pIVar9->super_Opnd);
    pOVar10 = pIVar5->m_dst;
    pIVar9 = IR::IntConstOpnd::New(0,TyInt8,*ppFVar11,false);
    func = *ppFVar11;
  }
  else {
    this_01 = IR::Instr::AsBranchInstr(this_00);
    IR::BranchInstr::Invert(this_01);
    pIVar9 = IR::IntConstOpnd::New(0,TyInt8,instr->m_func,false);
    IR::Instr::SetSrc1(instr,&pIVar9->super_Opnd);
    instr->m_opcode = Ld_I4;
    pOVar10 = instr->m_dst;
    local_40 = 1;
    pIVar9 = IR::IntConstOpnd::New(1,TyInt8,instr->m_func,false);
    pIVar6 = IR::Instr::New(Ld_I4,pOVar10,&pIVar9->super_Opnd,instr->m_func);
    IR::Instr::SetByteCodeOffset(pIVar6,this_00);
    IR::Instr::InsertAfter(this_00,pIVar6);
    if (pIVar5 == (Instr *)0x0) {
      return this_00;
    }
    ppFVar11 = &instr->m_func;
    pIVar9 = IR::IntConstOpnd::New(0,TyInt8,*ppFVar11,false);
    IR::Instr::ReplaceSrc1(pIVar5,&pIVar9->super_Opnd);
    pOVar10 = pIVar5->m_dst;
    pIVar9 = IR::IntConstOpnd::New(1,TyInt8,*ppFVar11,false);
    func = *ppFVar11;
    value = 0;
  }
  ppFVar11 = &instr->m_func;
  pIVar5 = IR::Instr::New(Ld_I4,pOVar10,&pIVar9->super_Opnd,func);
  IR::Instr::SetByteCodeOffset(pIVar5,this_00);
  IR::Instr::InsertAfter(this_00,pIVar5);
  if (this_02 != (Instr *)0x0) {
    pIVar9 = IR::IntConstOpnd::New(value,TyInt8,*ppFVar11,false);
    IR::Instr::ReplaceSrc1(this_02,&pIVar9->super_Opnd);
    pOVar10 = this_02->m_dst;
    pIVar9 = IR::IntConstOpnd::New(local_40,TyInt8,*ppFVar11,false);
    pIVar5 = IR::Instr::New(Ld_I4,pOVar10,&pIVar9->super_Opnd,*ppFVar11);
    IR::Instr::SetByteCodeOffset(pIVar5,this_00);
    IR::Instr::InsertAfter(this_00,pIVar5);
    return this_00;
  }
  return this_00;
}

Assistant:

IR::Instr *
FlowGraph::PeepTypedCm(IR::Instr *instr)
{
    // Basic pattern, peep:
    //      t1 = CmEq a, b
    //      BrTrue_I4 $L1, t1
    // Into:
    //      t1 = 1
    //      BrEq $L1, a, b
    //      t1 = 0

    IR::Instr * instrNext = instr->GetNextRealInstrOrLabel();

    // find intermediate Lds
    IR::Instr * instrLd = nullptr;
    if (instrNext->m_opcode == Js::OpCode::Ld_I4)
    {
        instrLd = instrNext;
        instrNext = instrNext->GetNextRealInstrOrLabel();
    }

    IR::Instr * instrLd2 = nullptr;
    if (instrNext->m_opcode == Js::OpCode::Ld_I4)
    {
        instrLd2 = instrNext;
        instrNext = instrNext->GetNextRealInstrOrLabel();
    }

    // Find BrTrue/BrFalse
    IR::Instr *instrBr;
    bool brIsTrue;
    if (instrNext->m_opcode == Js::OpCode::BrTrue_I4)
    {
        instrBr = instrNext;
        brIsTrue = true;
    }
    else if (instrNext->m_opcode == Js::OpCode::BrFalse_I4)
    {
        instrBr = instrNext;
        brIsTrue = false;
    }
    else
    {
        return nullptr;
    }

    AssertMsg(instrLd || (!instrLd && !instrLd2), "Either instrLd is non-null or both null");

    // if we have intermediate Lds, then make sure pattern is:
    //      t1 = CmEq a, b
    //      t2 = Ld_A t1
    //      BrTrue $L1, t2
    if (instrLd && !instrLd->GetSrc1()->IsEqual(instr->GetDst()))
    {
        return nullptr;
    }

    if (instrLd2 && !instrLd2->GetSrc1()->IsEqual(instrLd->GetDst()))
    {
        return nullptr;
    }

    // Make sure we have:
    //      t1 = CmEq a, b
    //           BrTrue/BrFalse t1
    if (!(instr->GetDst()->IsEqual(instrBr->GetSrc1()) || (instrLd && instrLd->GetDst()->IsEqual(instrBr->GetSrc1())) || (instrLd2 && instrLd2->GetDst()->IsEqual(instrBr->GetSrc1()))))
    {
        return nullptr;
    }

    IR::Opnd * src1 = instr->UnlinkSrc1();
    IR::Opnd * src2 = instr->UnlinkSrc2();

    IR::Instr * instrNew;
    IR::Opnd * tmpOpnd;
    if (instr->GetDst()->IsEqual(src1) || (instrLd && instrLd->GetDst()->IsEqual(src1)) || (instrLd2 && instrLd2->GetDst()->IsEqual(src1)))
    {
        Assert(src1->IsInt32());

        tmpOpnd = IR::RegOpnd::New(TyInt32, instr->m_func);
        instrNew = IR::Instr::New(Js::OpCode::Ld_I4, tmpOpnd, src1, instr->m_func);
        instrNew->SetByteCodeOffset(instr);
        instr->InsertBefore(instrNew);
        src1 = tmpOpnd;
    }

    if (instr->GetDst()->IsEqual(src2) || (instrLd && instrLd->GetDst()->IsEqual(src2)) || (instrLd2 && instrLd2->GetDst()->IsEqual(src2)))
    {
        Assert(src2->IsInt32());

        tmpOpnd = IR::RegOpnd::New(TyInt32, instr->m_func);
        instrNew = IR::Instr::New(Js::OpCode::Ld_I4, tmpOpnd, src2, instr->m_func);
        instrNew->SetByteCodeOffset(instr);
        instr->InsertBefore(instrNew);
        src2 = tmpOpnd;
    }

    instrBr->ReplaceSrc1(src1);
    instrBr->SetSrc2(src2);

    Js::OpCode newOpcode;
    switch (instr->m_opcode)
    {
    case Js::OpCode::CmEq_I4:
        newOpcode = Js::OpCode::BrEq_I4;
        break;
    case Js::OpCode::CmGe_I4:
        newOpcode = Js::OpCode::BrGe_I4;
        break;
    case Js::OpCode::CmGt_I4:
        newOpcode = Js::OpCode::BrGt_I4;
        break;
    case Js::OpCode::CmLt_I4:
        newOpcode = Js::OpCode::BrLt_I4;
        break;
    case Js::OpCode::CmLe_I4:
        newOpcode = Js::OpCode::BrLe_I4;
        break;
    case Js::OpCode::CmUnGe_I4:
        newOpcode = Js::OpCode::BrUnGe_I4;
        break;
    case Js::OpCode::CmUnGt_I4:
        newOpcode = Js::OpCode::BrUnGt_I4;
        break;
    case Js::OpCode::CmUnLt_I4:
        newOpcode = Js::OpCode::BrUnLt_I4;
        break;
    case Js::OpCode::CmUnLe_I4:
        newOpcode = Js::OpCode::BrUnLe_I4;
        break;
    case Js::OpCode::CmNeq_I4:
        newOpcode = Js::OpCode::BrNeq_I4;
        break;
    case Js::OpCode::CmEq_A:
        newOpcode = Js::OpCode::BrEq_A;
        break;
    case Js::OpCode::CmGe_A:
        newOpcode = Js::OpCode::BrGe_A;
        break;
    case Js::OpCode::CmGt_A:
        newOpcode = Js::OpCode::BrGt_A;
        break;
    case Js::OpCode::CmLt_A:
        newOpcode = Js::OpCode::BrLt_A;
        break;
    case Js::OpCode::CmLe_A:
        newOpcode = Js::OpCode::BrLe_A;
        break;
    case Js::OpCode::CmUnGe_A:
        newOpcode = Js::OpCode::BrUnGe_A;
        break;
    case Js::OpCode::CmUnGt_A:
        newOpcode = Js::OpCode::BrUnGt_A;
        break;
    case Js::OpCode::CmUnLt_A:
        newOpcode = Js::OpCode::BrUnLt_A;
        break;
    case Js::OpCode::CmUnLe_A:
        newOpcode = Js::OpCode::BrUnLe_A;
        break;
    case Js::OpCode::CmNeq_A:
        newOpcode = Js::OpCode::BrNeq_A;
        break;
    case Js::OpCode::CmSrEq_A:
        newOpcode = Js::OpCode::BrSrEq_A;
        break;
    case Js::OpCode::CmSrNeq_A:
        newOpcode = Js::OpCode::BrSrNeq_A;
        break;
    default:
        newOpcode = Js::OpCode::InvalidOpCode;
        Assume(UNREACHED);
    }

    instrBr->m_opcode = newOpcode;

    if (brIsTrue)
    {
        instr->SetSrc1(IR::IntConstOpnd::New(1, TyInt8, instr->m_func));
        instr->m_opcode = Js::OpCode::Ld_I4;
        instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instr->GetDst(), IR::IntConstOpnd::New(0, TyInt8, instr->m_func), instr->m_func);
        instrNew->SetByteCodeOffset(instrBr);
        instrBr->InsertAfter(instrNew);
        if (instrLd)
        {
            instrLd->ReplaceSrc1(IR::IntConstOpnd::New(1, TyInt8, instr->m_func));
            instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instrLd->GetDst(), IR::IntConstOpnd::New(0, TyInt8, instr->m_func), instr->m_func);
            instrNew->SetByteCodeOffset(instrBr);
            instrBr->InsertAfter(instrNew);

            if (instrLd2)
            {
                instrLd2->ReplaceSrc1(IR::IntConstOpnd::New(1, TyInt8, instr->m_func));
                instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instrLd2->GetDst(), IR::IntConstOpnd::New(0, TyInt8, instr->m_func), instr->m_func);
                instrNew->SetByteCodeOffset(instrBr);
                instrBr->InsertAfter(instrNew);
            }
        }
    }
    else
    {
        instrBr->AsBranchInstr()->Invert();

        instr->SetSrc1(IR::IntConstOpnd::New(0, TyInt8, instr->m_func));
        instr->m_opcode = Js::OpCode::Ld_I4;
        instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instr->GetDst(), IR::IntConstOpnd::New(1, TyInt8, instr->m_func), instr->m_func);
        instrNew->SetByteCodeOffset(instrBr);
        instrBr->InsertAfter(instrNew);
        if (instrLd)
        {
            instrLd->ReplaceSrc1(IR::IntConstOpnd::New(0, TyInt8, instr->m_func));
            instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instrLd->GetDst(), IR::IntConstOpnd::New(1, TyInt8, instr->m_func), instr->m_func);
            instrNew->SetByteCodeOffset(instrBr);
            instrBr->InsertAfter(instrNew);

            if (instrLd2)
            {
                instrLd2->ReplaceSrc1(IR::IntConstOpnd::New(0, TyInt8, instr->m_func));
                instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instrLd2->GetDst(), IR::IntConstOpnd::New(1, TyInt8, instr->m_func), instr->m_func);
                instrNew->SetByteCodeOffset(instrBr);
                instrBr->InsertAfter(instrNew);
            }
        }
    }

    return instrBr;
}